

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O0

void __thiscall
validation_layer::parameterValidationChecker::parameterValidationChecker
          (parameterValidationChecker *this)

{
  bool bVar1;
  ZESParameterValidation *pZVar2;
  ZETParameterValidation *this_00;
  context_t *pcVar3;
  value_type local_30;
  ZETParameterValidation *local_28;
  ZETParameterValidation *zetChecker;
  ZESParameterValidation *zesChecker;
  ZEParameterValidation *zeChecker;
  parameterValidationChecker *this_local;
  
  this->enableParameterValidation = false;
  zeChecker = (ZEParameterValidation *)this;
  bVar1 = getenv_tobool("ZE_ENABLE_PARAMETER_VALIDATION");
  this->enableParameterValidation = bVar1;
  if ((this->enableParameterValidation & 1U) != 0) {
    pZVar2 = (ZESParameterValidation *)operator_new(8);
    ZEParameterValidation::ZEParameterValidation((ZEParameterValidation *)pZVar2);
    zesChecker = pZVar2;
    pZVar2 = (ZESParameterValidation *)operator_new(8);
    ZESParameterValidation::ZESParameterValidation(pZVar2);
    zetChecker = (ZETParameterValidation *)pZVar2;
    this_00 = (ZETParameterValidation *)operator_new(8);
    ZETParameterValidation::ZETParameterValidation(this_00);
    parameterChecker = zesChecker;
    DAT_00322f68 = zetChecker;
    DAT_00322f70 = this_00;
    local_28 = this_00;
    pcVar3 = context_t::getInstance();
    local_30 = (value_type)&parameterChecker;
    std::
    vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
    ::push_back(&pcVar3->validationHandlers,&local_30);
  }
  return;
}

Assistant:

parameterValidationChecker::parameterValidationChecker() {
        enableParameterValidation = getenv_tobool( "ZE_ENABLE_PARAMETER_VALIDATION" );
        if(enableParameterValidation) {
            ZEParameterValidation *zeChecker = new ZEParameterValidation;
            ZESParameterValidation *zesChecker = new ZESParameterValidation;
            ZETParameterValidation *zetChecker = new ZETParameterValidation;
            parameterChecker.zeValidation = zeChecker;
            parameterChecker.zetValidation = zetChecker;
            parameterChecker.zesValidation = zesChecker;
            validation_layer::context.getInstance().validationHandlers.push_back(&parameterChecker);
        }
    }